

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scorer.cc
# Opt level: O0

base_learner * scorer_setup(options_i *options,vw *all)

{
  int iVar1;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  pointer psVar2;
  string *pmessage;
  undefined8 uVar3;
  single_learner *psVar4;
  option_group_definition *this_00;
  vw *in_RSI;
  undefined8 *in_RDI;
  stringstream __msg;
  _func_void_scorer_ptr_single_learner_ptr_example_ptr_size_t_size_t_polyprediction_ptr_bool
  *multipredict_f;
  learner<scorer,_example> *l;
  single_learner *base;
  option_group_definition new_options;
  string link;
  free_ptr<scorer> s;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffb38;
  vw *in_stack_fffffffffffffb40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb48;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffb50;
  undefined8 in_stack_fffffffffffffb60;
  int plineNumber;
  char *in_stack_fffffffffffffb68;
  vw_exception *in_stack_fffffffffffffb70;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffb88;
  vw *pvVar5;
  option_group_definition *in_stack_fffffffffffffb90;
  stringstream local_408 [16];
  stringstream local_3f8 [248];
  learner<scorer,_example> *in_stack_fffffffffffffd00;
  _func_void_scorer_ptr_learner<char,_example>_ptr_example_ptr_size_t_size_t_polyprediction_ptr_bool
  *local_280;
  learner<scorer,example> *local_278;
  allocator local_261;
  string local_260 [39];
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [375];
  allocator local_99;
  string local_98 [32];
  undefined1 local_78 [56];
  string local_40 [48];
  vw *local_10;
  undefined8 *local_8;
  
  plineNumber = (int)((ulong)in_stack_fffffffffffffb60 >> 0x20);
  local_10 = in_RSI;
  local_8 = in_RDI;
  scoped_calloc_or_throw<scorer>();
  std::__cxx11::string::string(local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"scorer options",&local_99);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffb40,
             (string *)in_stack_fffffffffffffb38);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"link",&local_211);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffffb48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"identity",&local_239);
  this = VW::config::
         typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::default_value(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(this,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_260,"Specify the link function: identity, logistic, glf1 or poisson",&local_261);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_fffffffffffffb40,(string *)in_stack_fffffffffffffb38);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffb40);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffb40);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  (**(code **)*local_8)(local_8,local_78);
  pvVar5 = local_10;
  psVar2 = std::unique_ptr<scorer,_void_(*)(void_*)>::operator->
                     ((unique_ptr<scorer,_void_(*)(void_*)> *)0x3d7ae9);
  psVar2->all = pvVar5;
  setup_base((options_i *)in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  LEARNER::as_singleline<char,char>((learner<char,_char> *)in_stack_fffffffffffffd00);
  local_280 = multipredict<&(id(float))>;
  iVar1 = std::__cxx11::string::compare((char *)local_40);
  if (iVar1 == 0) {
    local_278 = (learner<scorer,example> *)
                LEARNER::init_learner<scorer,example,LEARNER::learner<char,example>>
                          ((free_ptr<scorer> *)in_stack_fffffffffffffb50,
                           (learner<char,_example> *)in_stack_fffffffffffffb48,
                           (_func_void_scorer_ptr_learner<char,_example>_ptr_example_ptr *)
                           in_stack_fffffffffffffb40,
                           (_func_void_scorer_ptr_learner<char,_example>_ptr_example_ptr *)
                           in_stack_fffffffffffffb38);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)local_40);
    if (iVar1 == 0) {
      local_278 = (learner<scorer,example> *)
                  LEARNER::init_learner<scorer,example,LEARNER::learner<char,example>>
                            ((free_ptr<scorer> *)in_stack_fffffffffffffb50,
                             (learner<char,_example> *)in_stack_fffffffffffffb48,
                             (_func_void_scorer_ptr_learner<char,_example>_ptr_example_ptr *)
                             in_stack_fffffffffffffb40,
                             (_func_void_scorer_ptr_learner<char,_example>_ptr_example_ptr *)
                             in_stack_fffffffffffffb38);
      local_280 = multipredict<&(logistic(float))>;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)local_40);
      if (iVar1 == 0) {
        local_278 = (learner<scorer,example> *)
                    LEARNER::init_learner<scorer,example,LEARNER::learner<char,example>>
                              ((free_ptr<scorer> *)in_stack_fffffffffffffb50,
                               (learner<char,_example> *)in_stack_fffffffffffffb48,
                               (_func_void_scorer_ptr_learner<char,_example>_ptr_example_ptr *)
                               in_stack_fffffffffffffb40,
                               (_func_void_scorer_ptr_learner<char,_example>_ptr_example_ptr *)
                               in_stack_fffffffffffffb38);
        local_280 = multipredict<&(glf1(float))>;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)local_40);
        if (iVar1 != 0) {
          std::__cxx11::stringstream::stringstream(local_408);
          pmessage = (string *)
                     std::operator<<((ostream *)(local_408 + 0x10),"Unknown link function: ");
          std::operator<<((ostream *)pmessage,local_40);
          uVar3 = __cxa_allocate_exception(0x38);
          std::__cxx11::stringstream::str();
          VW::vw_exception::vw_exception
                    (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,plineNumber,pmessage);
          __cxa_throw(uVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        local_278 = (learner<scorer,example> *)
                    LEARNER::init_learner<scorer,example,LEARNER::learner<char,example>>
                              ((free_ptr<scorer> *)in_stack_fffffffffffffb50,
                               (learner<char,_example> *)in_stack_fffffffffffffb48,
                               (_func_void_scorer_ptr_learner<char,_example>_ptr_example_ptr *)
                               in_stack_fffffffffffffb40,
                               (_func_void_scorer_ptr_learner<char,_example>_ptr_example_ptr *)
                               in_stack_fffffffffffffb38);
        local_280 = multipredict<&expf>;
      }
    }
  }
  LEARNER::learner<scorer,example>::set_multipredict<LEARNER::learner<char,example>>
            (local_278,local_280);
  LEARNER::learner<scorer,example>::set_update<LEARNER::learner<char,example>>(local_278,update);
  psVar4 = LEARNER::as_singleline<scorer,example>(in_stack_fffffffffffffd00);
  local_10->scorer = psVar4;
  this_00 = (option_group_definition *)LEARNER::make_base<char,example>(local_10->scorer);
  VW::config::option_group_definition::~option_group_definition(this_00);
  std::__cxx11::string::~string(local_40);
  std::unique_ptr<scorer,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<scorer,_void_(*)(void_*)> *)in_stack_fffffffffffffb50);
  return (base_learner *)this_00;
}

Assistant:

LEARNER::base_learner* scorer_setup(options_i& options, vw& all)
{
  auto s = scoped_calloc_or_throw<scorer>();
  string link;
  option_group_definition new_options("scorer options");
  new_options.add(make_option("link", link)
                      .default_value("identity")
                      .keep()
                      .help("Specify the link function: identity, logistic, glf1 or poisson"));
  options.add_and_parse(new_options);

  // This always returns a base_learner.

  s->all = &all;

  auto base = as_singleline(setup_base(options, all));
  LEARNER::learner<scorer, example>* l;
  void (*multipredict_f)(scorer&, LEARNER::single_learner&, example&, size_t, size_t, polyprediction*, bool) =
      multipredict<id>;

  if (link.compare("identity") == 0)
    l = &init_learner(s, base, predict_or_learn<true, id>, predict_or_learn<false, id>);
  else if (link.compare("logistic") == 0)
  {
    l = &init_learner(s, base, predict_or_learn<true, logistic>, predict_or_learn<false, logistic>);
    multipredict_f = multipredict<logistic>;
  }
  else if (link.compare("glf1") == 0)
  {
    l = &init_learner(s, base, predict_or_learn<true, glf1>, predict_or_learn<false, glf1>);
    multipredict_f = multipredict<glf1>;
  }
  else if (link.compare("poisson") == 0)
  {
    l = &init_learner(s, base, predict_or_learn<true, expf>, predict_or_learn<false, expf>);
    multipredict_f = multipredict<expf>;
  }
  else
    THROW("Unknown link function: " << link);

  l->set_multipredict(multipredict_f);
  l->set_update(update);
  all.scorer = LEARNER::as_singleline(l);

  return make_base(*all.scorer);
}